

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Curve25519.c
# Opt level: O0

void Hacl_EC_Point_swap_conditional_(uint64_t *a,uint64_t *b,uint64_t swap1,uint32_t ctr)

{
  uint32_t in_ECX;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint32_t i;
  uint32_t in_stack_ffffffffffffffdc;
  
  if (in_ECX != 0) {
    Hacl_EC_Point_swap_conditional_step(in_RDI,in_RSI,(uint64_t)in_RDX,in_ECX);
    Hacl_EC_Point_swap_conditional_
              (in_RSI,in_RDX,CONCAT44(in_ECX,in_ECX - 1),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

static void
Hacl_EC_Point_swap_conditional_(uint64_t *a, uint64_t *b, uint64_t swap1, uint32_t ctr)
{
  if (!(ctr == (uint32_t)0U))
  {
    Hacl_EC_Point_swap_conditional_step(a, b, swap1, ctr);
    uint32_t i = ctr - (uint32_t)1U;
    Hacl_EC_Point_swap_conditional_(a, b, swap1, i);
  }
}